

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O1

ST_ssize_t __thiscall
ST::string::_find_last(string *this,size_t max,char *substr,size_t count,case_sensitivity_t cs)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  byte *__s1;
  byte *__s;
  byte *pbVar6;
  byte *pbVar7;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  char *ep;
  byte *pbVar11;
  
  pbVar2 = (byte *)(this->m_buffer).m_chars;
  uVar3 = (this->m_buffer).m_size;
  if (uVar3 < max) {
    max = uVar3;
  }
  pbVar11 = pbVar2 + max;
  __s = pbVar2;
  __s1 = (byte *)0x0;
  do {
    pbVar7 = __s1;
    if (cs != case_sensitive) {
      bVar1 = *substr;
      bVar4 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar4 = bVar1;
      }
      do {
        if (pbVar11 != __s && -1 < (long)pbVar11 - (long)__s) {
          do {
            bVar1 = *__s;
            bVar9 = bVar1 | 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar9 = bVar1;
            }
            if (bVar9 == bVar4) goto LAB_0019155b;
            __s = __s + 1;
          } while (__s < pbVar11);
        }
        __s = (byte *)0x0;
LAB_0019155b:
        if (__s == (byte *)0x0) {
          __s1 = (byte *)0x0;
          goto LAB_00191645;
        }
        pbVar6 = __s + count;
        __s1 = (byte *)0x0;
        if (pbVar11 < pbVar6) goto LAB_00191645;
        sVar8 = 0;
        do {
          if (count == sVar8) {
            iVar5 = 0;
            break;
          }
          bVar1 = __s[sVar8];
          bVar9 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar9 = bVar1;
          }
          bVar1 = substr[sVar8];
          bVar10 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar10 = bVar1;
          }
          sVar8 = sVar8 + 1;
          pbVar6 = (byte *)((ulong)pbVar6 & 0xffffffff);
          if (bVar9 != bVar10) {
            pbVar6 = (byte *)(ulong)(uint)((int)(char)bVar9 - (int)(char)bVar10);
          }
          iVar5 = (int)pbVar6;
        } while (bVar9 == bVar10);
        __s1 = __s;
        if (iVar5 == 0) goto LAB_00191645;
        __s = __s + 1;
      } while( true );
    }
    while( true ) {
      if ((long)pbVar11 - (long)__s == 0) {
        __s1 = (byte *)0x0;
      }
      else {
        __s1 = (byte *)memchr(__s,(int)*substr,(long)pbVar11 - (long)__s);
      }
      if ((count == 0) || (pbVar11 < __s1 + count || __s1 == (byte *)0x0)) break;
      iVar5 = bcmp(__s1,substr,count);
      if (iVar5 == 0) goto LAB_00191645;
      __s = __s1 + 1;
    }
    if (pbVar11 < __s1 + count || __s1 == (byte *)0x0) {
      __s1 = (byte *)0x0;
    }
LAB_00191645:
    __s = __s1 + 1;
    if (__s1 == (byte *)0x0 || pbVar11 <= __s1) {
      return -(ulong)(pbVar7 == (byte *)0x0) | (long)pbVar7 - (long)pbVar2;
    }
  } while( true );
}

Assistant:

ST_NODISCARD
        ST_ssize_t _find_last(size_t max, const char *substr, size_t count,
                              case_sensitivity_t cs = case_sensitive) const noexcept
        {
            const char *endp = c_str() + (max > size() ? size() : max);

            const char *start = c_str();
            const char *found = nullptr;
            for ( ;; ) {
                const char *cp = (cs == case_sensitive)
                        ? _ST_PRIVATE::find_cs(start, endp - start, substr, count)
                        : _ST_PRIVATE::find_ci(start, endp - start, substr, count);
                if (!cp || cp >= endp)
                    break;
                found = cp;
                start = cp + 1;
            }
            return found ? (found - c_str()) : -1;
        }